

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_analysis.cc
# Opt level: O0

size_t absl::lts_20240722::cord_internal::GetEstimatedMemoryUsage(Nonnull<const_CordRep_*> rep)

{
  size_t sVar1;
  Nonnull<const_CordRep_*> rep_local;
  
  sVar1 = anon_unknown_0::
          GetEstimatedUsage<(absl::lts_20240722::cord_internal::(anonymous_namespace)::Mode)1>(rep);
  return sVar1;
}

Assistant:

size_t GetEstimatedMemoryUsage(absl::Nonnull<const CordRep*> rep) {
  return GetEstimatedUsage<Mode::kTotal>(rep);
}